

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

iterator __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
::erase(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
        *this,iterator it)

{
  iterator it_00;
  iterator iVar1;
  ctrl_t *pcVar2;
  bool bVar3;
  iterator local_40;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *local_30;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *this_local;
  iterator it_local;
  iterator res;
  
  it_local.ctrl_ = (ctrl_t *)it.field_1;
  this_local = (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                *)it.ctrl_;
  local_30 = this;
  local_40 = end(this);
  bVar3 = priv::operator!=((iterator *)&this_local,&local_40);
  pcVar2 = it_local.ctrl_;
  if (!bVar3) {
    __assert_fail("it != end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x65a,
                  "iterator phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, phmap::Hash<int64_t>, std::equal_to<long>, std::allocator<long>>::erase(iterator) [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = phmap::Hash<int64_t>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
                 );
  }
  it_local.field_1.slot_ = (slot_type *)this_local;
  iterator::operator++((iterator *)&it_local.field_1);
  it_00.field_1.slot_ = (slot_type *)it_local.ctrl_;
  it_00.ctrl_ = (ctrl_t *)this_local;
  _erase(this,it_00);
  iVar1.field_1.slot_ = (slot_type *)pcVar2;
  iVar1.ctrl_ = (ctrl_t *)it_local.field_1.slot_;
  return iVar1;
}

Assistant:

iterator erase(iterator it) {
        assert(it != end());
        auto res = it;
        ++res;
        _erase(it);
        return res;
    }